

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.h
# Opt level: O1

void __thiscall PEFile::~PEFile(PEFile *this)

{
  ExeWrappersContainer *this_00;
  
  (this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__PEFile_00154fe0;
  this_00 = &(this->super_MappedExe).super_ExeWrappersContainer;
  (this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer =
       (_func_int **)&PTR__PEFile_00155100;
  this->dataDirEntries[0] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[1] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[2] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[3] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[4] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[5] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[6] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[7] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[8] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[9] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[10] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[0xb] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[0xc] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[0xd] = (DataDirEntryWrapper *)0x0;
  this->dataDirEntries[0xe] = (DataDirEntryWrapper *)0x0;
  ExeWrappersContainer::clearWrappers(this_00);
  this->optHdr = (OptHdrWrapper *)0x0;
  this->sects = (SectHdrsWrapper *)0x0;
  this->dosHdrWrapper = (DosHdrWrapper *)0x0;
  this->fHdr = (FileHdrWrapper *)0x0;
  if (this->album != (ResourcesAlbum *)0x0) {
    (*this->album->_vptr_ResourcesAlbum[1])();
  }
  QMutex::~QMutex(&this->m_peMutex);
  (this->core)._vptr_PECore = (_func_int **)&PTR__PECore_00159d30;
  PECore::reset(&this->core);
  ExeWrappersContainer::~ExeWrappersContainer(this_00);
  return;
}

Assistant:

virtual ~PEFile() { clearWrappers(); delete album; }